

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O3

void nni_pipe_bump_rx(nni_pipe *p,size_t bytes)

{
  nni_stat_inc(&p->st_rx_bytes,bytes);
  nni_stat_inc(&p->st_rx_msgs,1);
  return;
}

Assistant:

void
nni_pipe_bump_rx(nni_pipe *p, size_t bytes)
{
#ifdef NNG_ENABLE_STATS
	nni_stat_inc(&p->st_rx_bytes, bytes);
	nni_stat_inc(&p->st_rx_msgs, 1);
#else
	NNI_ARG_UNUSED(p);
	NNI_ARG_UNUSED(bytes);
#endif
}